

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void henson::
     Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::save(BinaryBuffer *bb,String *s)

{
  size_t sz;
  
  sz = s->_M_string_length;
  (**bb->_vptr_BinaryBuffer)(bb,&sz,8);
  (**bb->_vptr_BinaryBuffer)(bb,(s->_M_dataplus)._M_p,sz);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const String& s)
    {
      size_t sz = s.size();
      henson::save(bb, sz);
      henson::save(bb, s.c_str(), sz);
    }